

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
           *this,InternalString *key,void **value)

{
  Type *pTVar1;
  char *addr;
  DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_> *pDVar2;
  int *piVar3;
  DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_> *pDVar4;
  void *pvVar5;
  code *pcVar6;
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  long lVar11;
  hash_t hVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  char16_t *pcVar16;
  uint uVar17;
  ulong uVar18;
  char16_t *string1;
  uint uVar19;
  hash_t hVar20;
  Type *addr_00;
  uint uVar21;
  void *local_68;
  long local_60;
  InternalString *local_58;
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *local_50;
  uint local_44;
  WriteBarrierPtr<void> local_40;
  hash_t local_34;
  
  lVar11 = *(long *)this;
  local_40.ptr = value;
  if (lVar11 == 0) {
    BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar11 = *(long *)this;
  }
  if ((ulong)key->m_charLength == 0) {
    local_34 = 0x2393b8b;
  }
  else {
    uVar15 = 0x811c9dc5;
    uVar14 = 0;
    do {
      uVar17 = *(ushort *)
                ((long)(key->m_content).ptr + uVar14 * 2 + (ulong)((uint)key->m_offset * 2)) ^
               uVar15;
      uVar15 = uVar17 * 0x1000193;
      uVar14 = uVar14 + 1;
    } while (key->m_charLength != uVar14);
    local_34 = uVar17 * 0x2000326 + 1;
  }
  local_58 = key;
  local_44 = BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(local_34,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar15 = *(uint *)(lVar11 + (ulong)local_44 * 4);
  local_50 = (BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar15 < 0) {
    uVar21 = 0;
  }
  else {
    lVar11 = *(long *)(this + 8);
    uVar21 = 0;
    puVar10 = (undefined4 *)__tls_get_addr();
    hVar20 = local_34;
    do {
      uVar14 = (ulong)uVar15;
      uVar13 = (ulong)*(uint *)(lVar11 + 0x10 + uVar14 * 0x28);
      if (uVar13 == 0) {
        hVar12 = 0x2393b8b;
      }
      else {
        uVar17 = 0x811c9dc5;
        uVar18 = 0;
        do {
          uVar19 = *(ushort *)
                    ((ulong)((uint)*(byte *)(lVar11 + 0x14 + uVar14 * 0x28) * 2) +
                     *(long *)(lVar11 + 0x18 + uVar14 * 0x28) + uVar18 * 2) ^ uVar17;
          uVar17 = uVar19 * 0x1000193;
          uVar18 = uVar18 + 1;
        } while (uVar13 != uVar18);
        hVar12 = uVar19 * 0x2000326 + 1;
      }
      addr = (char *)(lVar11 + uVar14 * 0x28);
      if (hVar12 != *(hash_t *)(addr + 0x20)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                           ,199,
                           "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                           ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
        if (!bVar8) goto LAB_00f0c5f0;
        *puVar10 = 0;
        hVar12 = *(hash_t *)(addr + 0x20);
        hVar20 = local_34;
      }
      if ((hVar12 == hVar20) && (*(uint *)(addr + 0x10) == local_58->m_charLength)) {
        string1 = (char16_t *)((ulong)((uint)(byte)addr[0x14] * 2) + *(long *)(addr + 0x18));
        pcVar16 = (char16_t *)
                  ((ulong)((uint)local_58->m_offset * 2) + (long)(local_58->m_content).ptr);
        if ((string1 == pcVar16) ||
           (iVar9 = PAL_wmemcmp(string1,pcVar16,(ulong)*(uint *)(addr + 0x10)), hVar20 = local_34,
           iVar9 == 0)) {
          if (local_50->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(local_50->stats,uVar21);
          }
          pvVar5 = *local_40.ptr;
          Memory::Recycler::WBSetBit((char *)&local_68);
          local_68 = pvVar5;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
          pvVar5 = local_68;
          Memory::Recycler::WBSetBit(addr);
          *(void **)addr = pvVar5;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          return uVar15;
        }
      }
      uVar21 = uVar21 + 1;
      uVar15 = *(uint *)(addr + 8);
    } while (-1 < (int)uVar15);
  }
  pBVar7 = local_50;
  if (local_50->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_50->stats,uVar21);
  }
  if (pBVar7->freeCount == 0) {
    uVar15 = pBVar7->size;
    uVar17 = pBVar7->count;
    if (uVar17 == uVar15) {
      BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize(pBVar7);
      local_44 = BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket(local_34,pBVar7->bucketCount,pBVar7->modFunctionIndex);
      uVar15 = pBVar7->size;
      uVar17 = pBVar7->count;
    }
    pBVar7->count = uVar17 + 1;
    if ((int)uVar15 < (int)(uVar17 + 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar8) goto LAB_00f0c5f0;
      *puVar10 = 0;
      uVar15 = pBVar7->size;
    }
    if ((int)uVar15 <= (int)uVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar8) goto LAB_00f0c5f0;
      *puVar10 = 0;
    }
  }
  else {
    if (pBVar7->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar8) goto LAB_00f0c5f0;
      *puVar10 = 0;
    }
    uVar17 = pBVar7->freeList;
    if ((int)uVar17 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar8) goto LAB_00f0c5f0;
      *puVar10 = 0;
      uVar17 = pBVar7->freeList;
    }
    if (pBVar7->count <= (int)uVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar8) {
LAB_00f0c5f0:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar10 = 0;
      uVar17 = pBVar7->freeList;
    }
    pTVar1 = &pBVar7->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar9 = BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((pBVar7->entries).ptr + (int)uVar17);
      pBVar7->freeList = iVar9;
    }
  }
  pDVar2 = (local_50->entries).ptr;
  lVar11 = (long)(int)uVar17;
  pDVar4 = pDVar2 + lVar11;
  local_40.ptr = *local_40.ptr;
  local_60 = lVar11;
  Memory::Recycler::WBSetBit((char *)&local_68);
  local_68 = local_40.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
  local_40.ptr = local_68;
  Memory::Recycler::WBSetBit((char *)pDVar4);
  pBVar7 = local_50;
  pDVar2 = pDVar2 + lVar11;
  addr_00 = &(pDVar2->
             super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             ).super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
             super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
             .super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.key
             .m_content;
  (pDVar2->
  super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
  super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
  .super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.value.ptr =
       local_40.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pDVar4);
  (pDVar2->
  super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
  super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
  .super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.key.m_offset =
       local_58->m_offset;
  (pDVar2->
  super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
  super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
  .super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.key.
  m_charLength = local_58->m_charLength;
  pcVar16 = (local_58->m_content).ptr;
  Memory::Recycler::WBSetBit((char *)addr_00);
  addr_00->ptr = pcVar16;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  (pDVar2->
  super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).hashCode = local_34;
  piVar3 = (pBVar7->buckets).ptr;
  pDVar4 = (pBVar7->entries).ptr;
  pDVar4[lVar11].
  super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  .super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
  super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
  .super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.next =
       piVar3[local_44];
  piVar3[local_44] = (int)local_60;
  uVar21 = 0;
  uVar15 = uVar17;
  do {
    uVar15 = pDVar4[(int)uVar15].
             super_CacheHashedEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
             super_ValueEntry<Memory::WriteBarrierPtr<void>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>_>
             .super_KeyValueEntryDataLayout2<Js::InternalString,_Memory::WriteBarrierPtr<void>_>.
             next;
    uVar21 = uVar21 + 1;
  } while (uVar15 != 0xffffffff);
  if (pBVar7->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(pBVar7->stats,uVar21);
  }
  return uVar17;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }